

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined4 uVar57;
  undefined1 auVar58 [32];
  undefined4 uVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 (*pauVar73) [16];
  byte bVar74;
  int iVar75;
  uint uVar76;
  long lVar77;
  Scene *pSVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  uint uVar82;
  ulong uVar83;
  ulong uVar84;
  undefined1 (*pauVar85) [16];
  float fVar86;
  float fVar97;
  float fVar98;
  vint4 bi_1;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  float fVar99;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar96 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  vint4 bi;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  vint4 ai;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [32];
  undefined1 auVar116 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar125;
  undefined1 auVar124 [64];
  float fVar126;
  float fVar132;
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  float fVar130;
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar129 [64];
  float fVar136;
  float fVar138;
  float fVar139;
  uint uVar140;
  float fVar141;
  uint uVar142;
  float fVar143;
  uint uVar144;
  float fVar145;
  uint uVar146;
  float fVar147;
  uint uVar148;
  uint uVar149;
  undefined1 auVar137 [64];
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar151 [32];
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar159 [32];
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  Scene *scene;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1430 [16];
  Geometry *local_1420;
  ulong local_1418;
  long local_1410;
  undefined1 (*local_1408) [16];
  long local_1400;
  ulong local_13f8;
  RTCFilterFunctionNArguments local_13f0;
  undefined1 local_13c0 [8];
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  undefined4 uStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  Scene *local_1340;
  undefined1 auStack_1338 [24];
  undefined1 local_1310 [16];
  float local_1300;
  float fStack_12fc;
  float fStack_12f8;
  float fStack_12f4;
  float local_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  RTCHitN local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined4 local_1230;
  undefined4 uStack_122c;
  undefined4 uStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  uint local_1200;
  uint uStack_11fc;
  uint uStack_11f8;
  uint uStack_11f4;
  uint uStack_11f0;
  uint uStack_11ec;
  uint uStack_11e8;
  uint uStack_11e4;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  undefined4 uStack_1124;
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  float local_1080 [4];
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  undefined4 uStack_1064;
  float local_1060 [4];
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  undefined4 uStack_1044;
  float local_1040 [4];
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [8];
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar85 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_12b0._4_4_ = uVar1;
  local_12b0._0_4_ = uVar1;
  local_12b0._8_4_ = uVar1;
  local_12b0._12_4_ = uVar1;
  auVar124 = ZEXT1664(local_12b0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_12c0._4_4_ = uVar1;
  local_12c0._0_4_ = uVar1;
  local_12c0._8_4_ = uVar1;
  local_12c0._12_4_ = uVar1;
  auVar129 = ZEXT1664(local_12c0);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_12d0._4_4_ = uVar1;
  local_12d0._0_4_ = uVar1;
  local_12d0._8_4_ = uVar1;
  local_12d0._12_4_ = uVar1;
  auVar137 = ZEXT1664(local_12d0);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar97 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar98 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar83 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar81 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar84 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_13f8 = uVar83 ^ 0x10;
  iVar75 = (tray->tfar).field_0.i[k];
  auVar96 = ZEXT1664(CONCAT412(iVar75,CONCAT48(iVar75,CONCAT44(iVar75,iVar75))));
  iVar75 = (tray->tnear).field_0.i[k];
  local_1310._4_4_ = iVar75;
  local_1310._0_4_ = iVar75;
  local_1310._8_4_ = iVar75;
  local_1310._12_4_ = iVar75;
  auVar171 = ZEXT1664(local_1310);
  local_fe0._16_16_ = mm_lookupmask_ps._240_16_;
  local_fe0._0_16_ = mm_lookupmask_ps._0_16_;
  local_1408 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = 0x3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar117._16_4_ = 0x3f800000;
  auVar117._20_4_ = 0x3f800000;
  auVar117._24_4_ = 0x3f800000;
  auVar117._28_4_ = 0x3f800000;
  auVar104._8_4_ = 0xbf800000;
  auVar104._0_8_ = 0xbf800000bf800000;
  auVar104._12_4_ = 0xbf800000;
  auVar104._16_4_ = 0xbf800000;
  auVar104._20_4_ = 0xbf800000;
  auVar104._24_4_ = 0xbf800000;
  auVar104._28_4_ = 0xbf800000;
  _local_1000 = vblendvps_avx(auVar117,auVar104,local_fe0);
  fVar99 = fVar86;
  fVar100 = fVar86;
  fVar101 = fVar86;
  fVar102 = fVar97;
  fVar125 = fVar97;
  fVar162 = fVar97;
  fVar167 = fVar98;
  fVar168 = fVar98;
  fVar169 = fVar98;
  local_1300 = fVar98;
  fStack_12fc = fVar98;
  fStack_12f8 = fVar98;
  fStack_12f4 = fVar98;
  local_12f0 = fVar97;
  fStack_12ec = fVar97;
  fStack_12e8 = fVar97;
  fStack_12e4 = fVar97;
  local_12e0 = fVar86;
  fStack_12dc = fVar86;
  fStack_12d8 = fVar86;
  fStack_12d4 = fVar86;
LAB_00ef9fc8:
  do {
    do {
      if (pauVar85 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar73 = pauVar85 + -1;
      pauVar85 = pauVar85 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar73 + 8));
    uVar80 = *(ulong *)*pauVar85;
    while ((uVar80 & 8) == 0) {
      auVar88 = vsubps_avx(*(undefined1 (*) [16])(uVar80 + 0x20 + uVar83),auVar124._0_16_);
      auVar103._0_4_ = fVar86 * auVar88._0_4_;
      auVar103._4_4_ = fVar99 * auVar88._4_4_;
      auVar103._8_4_ = fVar100 * auVar88._8_4_;
      auVar103._12_4_ = fVar101 * auVar88._12_4_;
      auVar88 = vsubps_avx(*(undefined1 (*) [16])(uVar80 + 0x20 + uVar81),auVar129._0_16_);
      auVar87._0_4_ = fVar97 * auVar88._0_4_;
      auVar87._4_4_ = fVar102 * auVar88._4_4_;
      auVar87._8_4_ = fVar125 * auVar88._8_4_;
      auVar87._12_4_ = fVar162 * auVar88._12_4_;
      auVar88 = vpmaxsd_avx(auVar103,auVar87);
      auVar103 = vsubps_avx(*(undefined1 (*) [16])(uVar80 + 0x20 + uVar84),auVar137._0_16_);
      auVar127._0_4_ = fVar98 * auVar103._0_4_;
      auVar127._4_4_ = fVar167 * auVar103._4_4_;
      auVar127._8_4_ = fVar168 * auVar103._8_4_;
      auVar127._12_4_ = fVar169 * auVar103._12_4_;
      auVar103 = vpmaxsd_avx(auVar127,auVar171._0_16_);
      auVar103 = vpmaxsd_avx(auVar88,auVar103);
      auVar88 = vsubps_avx(*(undefined1 (*) [16])(uVar80 + 0x20 + local_13f8),auVar124._0_16_);
      auVar109._0_4_ = fVar86 * auVar88._0_4_;
      auVar109._4_4_ = fVar99 * auVar88._4_4_;
      auVar109._8_4_ = fVar100 * auVar88._8_4_;
      auVar109._12_4_ = fVar101 * auVar88._12_4_;
      auVar88 = vsubps_avx(*(undefined1 (*) [16])(uVar80 + 0x20 + (uVar81 ^ 0x10)),auVar129._0_16_);
      auVar114._0_4_ = fVar97 * auVar88._0_4_;
      auVar114._4_4_ = fVar102 * auVar88._4_4_;
      auVar114._8_4_ = fVar125 * auVar88._8_4_;
      auVar114._12_4_ = fVar162 * auVar88._12_4_;
      auVar88 = vpminsd_avx(auVar109,auVar114);
      auVar87 = vsubps_avx(*(undefined1 (*) [16])(uVar80 + 0x20 + (uVar84 ^ 0x10)),auVar137._0_16_);
      auVar115._0_4_ = fVar98 * auVar87._0_4_;
      auVar115._4_4_ = fVar167 * auVar87._4_4_;
      auVar115._8_4_ = fVar168 * auVar87._8_4_;
      auVar115._12_4_ = fVar169 * auVar87._12_4_;
      auVar87 = vpminsd_avx(auVar115,auVar96._0_16_);
      auVar88 = vpminsd_avx(auVar88,auVar87);
      auVar88 = vpcmpgtd_avx(auVar103,auVar88);
      iVar75 = vmovmskps_avx(auVar88);
      local_11e0._0_16_ = auVar103;
      if (iVar75 == 0xf) goto LAB_00ef9fc8;
      bVar74 = (byte)iVar75 ^ 0xf;
      uVar79 = uVar80 & 0xfffffffffffffff0;
      lVar77 = 0;
      if (bVar74 != 0) {
        for (; (bVar74 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
        }
      }
      uVar80 = *(ulong *)(uVar79 + lVar77 * 8);
      uVar82 = bVar74 - 1 & (uint)bVar74;
      if (uVar82 != 0) {
        uVar76 = *(uint *)(local_11e0 + lVar77 * 4);
        lVar77 = 0;
        if (uVar82 != 0) {
          for (; (uVar82 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
          }
        }
        uVar4 = *(ulong *)(uVar79 + lVar77 * 8);
        uVar140 = *(uint *)(local_11e0 + lVar77 * 4);
        uVar82 = uVar82 - 1 & uVar82;
        if (uVar82 == 0) {
          if (uVar76 < uVar140) {
            *(ulong *)*pauVar85 = uVar4;
            *(uint *)(*pauVar85 + 8) = uVar140;
            pauVar85 = pauVar85 + 1;
          }
          else {
            *(ulong *)*pauVar85 = uVar80;
            *(uint *)(*pauVar85 + 8) = uVar76;
            uVar80 = uVar4;
            pauVar85 = pauVar85 + 1;
          }
        }
        else {
          auVar88._8_8_ = 0;
          auVar88._0_8_ = uVar80;
          auVar88 = vpunpcklqdq_avx(auVar88,ZEXT416(uVar76));
          auVar110._8_8_ = 0;
          auVar110._0_8_ = uVar4;
          auVar103 = vpunpcklqdq_avx(auVar110,ZEXT416(uVar140));
          lVar77 = 0;
          if (uVar82 != 0) {
            for (; (uVar82 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
            }
          }
          auVar116._8_8_ = 0;
          auVar116._0_8_ = *(ulong *)(uVar79 + lVar77 * 8);
          auVar127 = vpunpcklqdq_avx(auVar116,ZEXT416(*(uint *)(local_11e0 + lVar77 * 4)));
          auVar87 = vpcmpgtd_avx(auVar103,auVar88);
          uVar82 = uVar82 - 1 & uVar82;
          if (uVar82 == 0) {
            auVar109 = vpshufd_avx(auVar87,0xaa);
            auVar87 = vblendvps_avx(auVar103,auVar88,auVar109);
            auVar88 = vblendvps_avx(auVar88,auVar103,auVar109);
            auVar103 = vpcmpgtd_avx(auVar127,auVar87);
            auVar109 = vpshufd_avx(auVar103,0xaa);
            auVar103 = vblendvps_avx(auVar127,auVar87,auVar109);
            auVar87 = vblendvps_avx(auVar87,auVar127,auVar109);
            auVar127 = vpcmpgtd_avx(auVar87,auVar88);
            auVar109 = vpshufd_avx(auVar127,0xaa);
            auVar127 = vblendvps_avx(auVar87,auVar88,auVar109);
            auVar88 = vblendvps_avx(auVar88,auVar87,auVar109);
            *pauVar85 = auVar88;
            pauVar85[1] = auVar127;
            uVar80 = auVar103._0_8_;
            pauVar85 = pauVar85 + 2;
          }
          else {
            lVar77 = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> lVar77 & 1) == 0; lVar77 = lVar77 + 1) {
              }
            }
            auVar119._8_8_ = 0;
            auVar119._0_8_ = *(ulong *)(uVar79 + lVar77 * 8);
            auVar114 = vpunpcklqdq_avx(auVar119,ZEXT416(*(uint *)(local_11e0 + lVar77 * 4)));
            auVar109 = vpshufd_avx(auVar87,0xaa);
            auVar87 = vblendvps_avx(auVar103,auVar88,auVar109);
            auVar88 = vblendvps_avx(auVar88,auVar103,auVar109);
            auVar103 = vpcmpgtd_avx(auVar114,auVar127);
            auVar109 = vpshufd_avx(auVar103,0xaa);
            auVar103 = vblendvps_avx(auVar114,auVar127,auVar109);
            auVar127 = vblendvps_avx(auVar127,auVar114,auVar109);
            auVar109 = vpcmpgtd_avx(auVar127,auVar88);
            auVar114 = vpshufd_avx(auVar109,0xaa);
            auVar109 = vblendvps_avx(auVar127,auVar88,auVar114);
            auVar88 = vblendvps_avx(auVar88,auVar127,auVar114);
            auVar127 = vpcmpgtd_avx(auVar103,auVar87);
            auVar114 = vpshufd_avx(auVar127,0xaa);
            auVar127 = vblendvps_avx(auVar103,auVar87,auVar114);
            auVar103 = vblendvps_avx(auVar87,auVar103,auVar114);
            auVar87 = vpcmpgtd_avx(auVar109,auVar103);
            auVar114 = vpshufd_avx(auVar87,0xaa);
            auVar87 = vblendvps_avx(auVar109,auVar103,auVar114);
            auVar103 = vblendvps_avx(auVar103,auVar109,auVar114);
            *pauVar85 = auVar88;
            pauVar85[1] = auVar103;
            pauVar85[2] = auVar87;
            uVar80 = auVar127._0_8_;
            pauVar85 = pauVar85 + 3;
          }
        }
      }
    }
    local_1400 = (ulong)((uint)uVar80 & 0xf) - 8;
    uVar80 = uVar80 & 0xfffffffffffffff0;
    for (local_1410 = 0; local_1410 != local_1400; local_1410 = local_1410 + 1) {
      lVar77 = local_1410 * 0x60;
      pSVar78 = context->scene;
      ppfVar5 = (pSVar78->vertices).items;
      pfVar6 = ppfVar5[*(uint *)(uVar80 + 0x40 + lVar77)];
      pfVar7 = ppfVar5[*(uint *)(uVar80 + 0x44 + lVar77)];
      pfVar8 = ppfVar5[*(uint *)(uVar80 + 0x48 + lVar77)];
      pfVar9 = ppfVar5[*(uint *)(uVar80 + 0x4c + lVar77)];
      auVar87 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar80 + lVar77)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar80 + 8 + lVar77)));
      auVar88 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar80 + lVar77)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar80 + 8 + lVar77)));
      auVar127 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar80 + 4 + lVar77)),
                               *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar80 + 0xc + lVar77)));
      auVar103 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar80 + 4 + lVar77)),
                               *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar80 + 0xc + lVar77)));
      auVar114 = vunpcklps_avx(auVar88,auVar103);
      auVar115 = vunpcklps_avx(auVar87,auVar127);
      auVar103 = vunpckhps_avx(auVar87,auVar127);
      auVar127 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar80 + 0x10 + lVar77)),
                               *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar80 + 0x18 + lVar77)));
      auVar88 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar80 + 0x10 + lVar77)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar80 + 0x18 + lVar77)));
      auVar109 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar80 + 0x14 + lVar77)),
                               *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar80 + 0x1c + lVar77)));
      auVar87 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar80 + 0x14 + lVar77)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar80 + 0x1c + lVar77)));
      auVar110 = vunpcklps_avx(auVar88,auVar87);
      auVar116 = vunpcklps_avx(auVar127,auVar109);
      auVar87 = vunpckhps_avx(auVar127,auVar109);
      auVar109 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar80 + 0x20 + lVar77)),
                               *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar80 + 0x28 + lVar77)));
      auVar88 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar80 + 0x20 + lVar77)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar80 + 0x28 + lVar77)));
      auVar119 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar80 + 0x24 + lVar77)),
                               *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar80 + 0x2c + lVar77)));
      auVar127 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar80 + 0x24 + lVar77)),
                               *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar80 + 0x2c + lVar77)));
      auVar89 = vunpcklps_avx(auVar88,auVar127);
      auVar53 = vunpcklps_avx(auVar109,auVar119);
      auVar127 = vunpckhps_avx(auVar109,auVar119);
      auVar119 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar80 + 0x30 + lVar77)),
                               *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar80 + 0x38 + lVar77)));
      auVar88 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar80 + 0x30 + lVar77)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar80 + 0x38 + lVar77)));
      auVar54 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar80 + 0x34 + lVar77)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar80 + 0x3c + lVar77)));
      auVar109 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar80 + 0x34 + lVar77)),
                               *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar80 + 0x3c + lVar77)));
      auVar55 = vunpcklps_avx(auVar88,auVar109);
      auVar56 = vunpcklps_avx(auVar119,auVar54);
      auVar88 = *(undefined1 (*) [16])(uVar80 + 0x40 + lVar77);
      local_fc0._16_16_ = auVar88;
      local_fc0._0_16_ = auVar88;
      auVar109 = vunpckhps_avx(auVar119,auVar54);
      lVar77 = uVar80 + 0x50 + lVar77;
      local_12a0 = *(undefined8 *)(lVar77 + 0x10);
      uStack_1298 = *(undefined8 *)(lVar77 + 0x18);
      uStack_1290 = local_12a0;
      uStack_1288 = uStack_1298;
      auVar120._16_16_ = auVar53;
      auVar120._0_16_ = auVar115;
      auVar121._16_16_ = auVar127;
      auVar121._0_16_ = auVar103;
      auVar128._16_16_ = auVar89;
      auVar128._0_16_ = auVar114;
      auVar105._16_16_ = auVar116;
      auVar105._0_16_ = auVar116;
      auVar122._16_16_ = auVar87;
      auVar122._0_16_ = auVar87;
      auVar111._16_16_ = auVar110;
      auVar111._0_16_ = auVar110;
      auVar151._16_16_ = auVar56;
      auVar151._0_16_ = auVar56;
      auVar159._16_16_ = auVar109;
      auVar159._0_16_ = auVar109;
      auVar90._16_16_ = auVar55;
      auVar90._0_16_ = auVar55;
      auVar105 = vsubps_avx(auVar120,auVar105);
      auVar104 = vsubps_avx(auVar121,auVar122);
      auVar117 = vsubps_avx(auVar128,auVar111);
      auVar92 = vsubps_avx(auVar151,auVar120);
      auVar111 = vsubps_avx(auVar159,auVar121);
      auVar90 = vsubps_avx(auVar90,auVar128);
      fVar99 = auVar104._0_4_;
      fVar158 = auVar90._0_4_;
      fVar168 = auVar104._4_4_;
      fVar160 = auVar90._4_4_;
      auVar51._4_4_ = fVar160 * fVar168;
      auVar51._0_4_ = fVar158 * fVar99;
      fVar16 = auVar104._8_4_;
      fVar161 = auVar90._8_4_;
      auVar51._8_4_ = fVar161 * fVar16;
      fVar23 = auVar104._12_4_;
      fVar163 = auVar90._12_4_;
      auVar51._12_4_ = fVar163 * fVar23;
      fVar30 = auVar104._16_4_;
      fVar164 = auVar90._16_4_;
      auVar51._16_4_ = fVar164 * fVar30;
      fVar37 = auVar104._20_4_;
      fVar165 = auVar90._20_4_;
      auVar51._20_4_ = fVar165 * fVar37;
      fVar44 = auVar104._24_4_;
      fVar166 = auVar90._24_4_;
      auVar51._24_4_ = fVar166 * fVar44;
      auVar51._28_4_ = auVar55._12_4_;
      fVar100 = auVar117._0_4_;
      fVar150 = auVar111._0_4_;
      fVar169 = auVar117._4_4_;
      fVar152 = auVar111._4_4_;
      auVar52._4_4_ = fVar152 * fVar169;
      auVar52._0_4_ = fVar150 * fVar100;
      fVar17 = auVar117._8_4_;
      fVar153 = auVar111._8_4_;
      auVar52._8_4_ = fVar153 * fVar17;
      fVar24 = auVar117._12_4_;
      fVar154 = auVar111._12_4_;
      auVar52._12_4_ = fVar154 * fVar24;
      fVar31 = auVar117._16_4_;
      fVar155 = auVar111._16_4_;
      auVar52._16_4_ = fVar155 * fVar31;
      fVar38 = auVar117._20_4_;
      fVar156 = auVar111._20_4_;
      auVar52._20_4_ = fVar156 * fVar38;
      fVar45 = auVar117._24_4_;
      uVar57 = auVar116._12_4_;
      fVar157 = auVar111._24_4_;
      auVar52._24_4_ = fVar157 * fVar45;
      auVar52._28_4_ = uVar57;
      local_13a0 = vsubps_avx(auVar52,auVar51);
      fVar136 = auVar92._0_4_;
      fVar138 = auVar92._4_4_;
      auVar58._4_4_ = fVar138 * fVar169;
      auVar58._0_4_ = fVar136 * fVar100;
      fVar139 = auVar92._8_4_;
      auVar58._8_4_ = fVar139 * fVar17;
      fVar141 = auVar92._12_4_;
      auVar58._12_4_ = fVar141 * fVar24;
      fVar143 = auVar92._16_4_;
      auVar58._16_4_ = fVar143 * fVar31;
      fVar145 = auVar92._20_4_;
      auVar58._20_4_ = fVar145 * fVar38;
      fVar147 = auVar92._24_4_;
      auVar58._24_4_ = fVar147 * fVar45;
      auVar58._28_4_ = uVar57;
      fVar101 = auVar105._0_4_;
      fVar11 = auVar105._4_4_;
      auVar60._4_4_ = fVar160 * fVar11;
      auVar60._0_4_ = fVar158 * fVar101;
      fVar18 = auVar105._8_4_;
      auVar60._8_4_ = fVar161 * fVar18;
      fVar25 = auVar105._12_4_;
      auVar60._12_4_ = fVar163 * fVar25;
      fVar32 = auVar105._16_4_;
      auVar60._16_4_ = fVar164 * fVar32;
      fVar39 = auVar105._20_4_;
      auVar60._20_4_ = fVar165 * fVar39;
      fVar46 = auVar105._24_4_;
      uVar59 = auVar110._12_4_;
      auVar60._24_4_ = fVar166 * fVar46;
      auVar60._28_4_ = uVar59;
      auVar104 = vsubps_avx(auVar60,auVar58);
      auVar61._4_4_ = fVar152 * fVar11;
      auVar61._0_4_ = fVar150 * fVar101;
      auVar61._8_4_ = fVar153 * fVar18;
      auVar61._12_4_ = fVar154 * fVar25;
      auVar61._16_4_ = fVar155 * fVar32;
      auVar61._20_4_ = fVar156 * fVar39;
      auVar61._24_4_ = fVar157 * fVar46;
      auVar61._28_4_ = uVar59;
      auVar62._4_4_ = fVar138 * fVar168;
      auVar62._0_4_ = fVar136 * fVar99;
      auVar62._8_4_ = fVar139 * fVar16;
      auVar62._12_4_ = fVar141 * fVar23;
      auVar62._16_4_ = fVar143 * fVar30;
      auVar62._20_4_ = fVar145 * fVar37;
      auVar62._24_4_ = fVar147 * fVar44;
      auVar62._28_4_ = auVar88._12_4_;
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar170._4_4_ = uVar1;
      auVar170._0_4_ = uVar1;
      auVar170._8_4_ = uVar1;
      auVar170._12_4_ = uVar1;
      auVar170._16_4_ = uVar1;
      auVar170._20_4_ = uVar1;
      auVar170._24_4_ = uVar1;
      auVar170._28_4_ = uVar1;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar172._4_4_ = uVar2;
      auVar172._0_4_ = uVar2;
      auVar172._8_4_ = uVar2;
      auVar172._12_4_ = uVar2;
      auVar172._16_4_ = uVar2;
      auVar172._20_4_ = uVar2;
      auVar172._24_4_ = uVar2;
      auVar172._28_4_ = uVar2;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar173._4_4_ = uVar3;
      auVar173._0_4_ = uVar3;
      auVar173._8_4_ = uVar3;
      auVar173._12_4_ = uVar3;
      auVar173._16_4_ = uVar3;
      auVar173._20_4_ = uVar3;
      auVar173._24_4_ = uVar3;
      auVar173._28_4_ = uVar3;
      fVar86 = *(float *)(ray + k * 4 + 0x50);
      local_1120 = vsubps_avx(auVar62,auVar61);
      auVar117 = vsubps_avx(auVar120,auVar170);
      fVar97 = *(float *)(ray + k * 4 + 0x60);
      auVar51 = vsubps_avx(auVar121,auVar172);
      auVar52 = vsubps_avx(auVar128,auVar173);
      fVar126 = auVar52._0_4_;
      fVar130 = auVar52._4_4_;
      auVar63._4_4_ = fVar130 * fVar86;
      auVar63._0_4_ = fVar126 * fVar86;
      fVar131 = auVar52._8_4_;
      auVar63._8_4_ = fVar131 * fVar86;
      fVar132 = auVar52._12_4_;
      auVar63._12_4_ = fVar132 * fVar86;
      fVar133 = auVar52._16_4_;
      auVar63._16_4_ = fVar133 * fVar86;
      fVar134 = auVar52._20_4_;
      auVar63._20_4_ = fVar134 * fVar86;
      fVar135 = auVar52._24_4_;
      auVar63._24_4_ = fVar135 * fVar86;
      auVar63._28_4_ = uVar1;
      fVar102 = auVar51._0_4_;
      fVar12 = auVar51._4_4_;
      auVar64._4_4_ = fVar97 * fVar12;
      auVar64._0_4_ = fVar97 * fVar102;
      fVar19 = auVar51._8_4_;
      auVar64._8_4_ = fVar97 * fVar19;
      fVar26 = auVar51._12_4_;
      auVar64._12_4_ = fVar97 * fVar26;
      fVar33 = auVar51._16_4_;
      auVar64._16_4_ = fVar97 * fVar33;
      fVar40 = auVar51._20_4_;
      auVar64._20_4_ = fVar97 * fVar40;
      fVar47 = auVar51._24_4_;
      auVar64._24_4_ = fVar97 * fVar47;
      auVar64._28_4_ = uVar2;
      auVar51 = vsubps_avx(auVar64,auVar63);
      fVar98 = *(float *)(ray + k * 4 + 0x40);
      fVar125 = auVar117._0_4_;
      fVar13 = auVar117._4_4_;
      auVar65._4_4_ = fVar97 * fVar13;
      auVar65._0_4_ = fVar97 * fVar125;
      fVar20 = auVar117._8_4_;
      auVar65._8_4_ = fVar97 * fVar20;
      fVar27 = auVar117._12_4_;
      auVar65._12_4_ = fVar97 * fVar27;
      fVar34 = auVar117._16_4_;
      auVar65._16_4_ = fVar97 * fVar34;
      fVar41 = auVar117._20_4_;
      auVar65._20_4_ = fVar97 * fVar41;
      fVar48 = auVar117._24_4_;
      auVar65._24_4_ = fVar97 * fVar48;
      auVar65._28_4_ = uVar3;
      auVar66._4_4_ = fVar130 * fVar98;
      auVar66._0_4_ = fVar126 * fVar98;
      auVar66._8_4_ = fVar131 * fVar98;
      auVar66._12_4_ = fVar132 * fVar98;
      auVar66._16_4_ = fVar133 * fVar98;
      auVar66._20_4_ = fVar134 * fVar98;
      auVar66._24_4_ = fVar135 * fVar98;
      auVar66._28_4_ = uVar57;
      auVar117 = vsubps_avx(auVar66,auVar65);
      auVar67._4_4_ = fVar98 * fVar12;
      auVar67._0_4_ = fVar98 * fVar102;
      auVar67._8_4_ = fVar98 * fVar19;
      auVar67._12_4_ = fVar98 * fVar26;
      auVar67._16_4_ = fVar98 * fVar33;
      auVar67._20_4_ = fVar98 * fVar40;
      auVar67._24_4_ = fVar98 * fVar47;
      auVar67._28_4_ = uVar3;
      auVar68._4_4_ = fVar13 * fVar86;
      auVar68._0_4_ = fVar125 * fVar86;
      auVar68._8_4_ = fVar20 * fVar86;
      auVar68._12_4_ = fVar27 * fVar86;
      auVar68._16_4_ = fVar34 * fVar86;
      auVar68._20_4_ = fVar41 * fVar86;
      auVar68._24_4_ = fVar48 * fVar86;
      auVar68._28_4_ = uVar59;
      auVar52 = vsubps_avx(auVar68,auVar67);
      local_13c0._0_4_ = auVar104._0_4_;
      local_13c0._4_4_ = auVar104._4_4_;
      fStack_13b8 = auVar104._8_4_;
      fStack_13b4 = auVar104._12_4_;
      fStack_13b0 = auVar104._16_4_;
      fStack_13ac = auVar104._20_4_;
      fStack_13a8 = auVar104._24_4_;
      uStack_13a4 = auVar104._28_4_;
      fVar162 = local_1120._0_4_;
      fVar14 = local_1120._4_4_;
      fVar21 = local_1120._8_4_;
      fVar28 = local_1120._12_4_;
      fVar35 = local_1120._16_4_;
      fVar42 = local_1120._20_4_;
      fVar49 = local_1120._24_4_;
      fVar167 = local_13a0._0_4_;
      fVar15 = local_13a0._4_4_;
      fVar22 = local_13a0._8_4_;
      fVar29 = local_13a0._12_4_;
      fVar36 = local_13a0._16_4_;
      fVar43 = local_13a0._20_4_;
      fVar50 = local_13a0._24_4_;
      auVar91._0_4_ = fVar98 * fVar167 + fVar97 * fVar162 + (float)local_13c0._0_4_ * fVar86;
      auVar91._4_4_ = fVar98 * fVar15 + fVar97 * fVar14 + (float)local_13c0._4_4_ * fVar86;
      auVar91._8_4_ = fVar98 * fVar22 + fVar97 * fVar21 + fStack_13b8 * fVar86;
      auVar91._12_4_ = fVar98 * fVar29 + fVar97 * fVar28 + fStack_13b4 * fVar86;
      auVar91._16_4_ = fVar98 * fVar36 + fVar97 * fVar35 + fStack_13b0 * fVar86;
      auVar91._20_4_ = fVar98 * fVar43 + fVar97 * fVar42 + fStack_13ac * fVar86;
      auVar91._24_4_ = fVar98 * fVar50 + fVar97 * fVar49 + fStack_13a8 * fVar86;
      auVar91._28_4_ = fVar97 + fVar97 + fVar86;
      auVar112._8_4_ = 0x80000000;
      auVar112._0_8_ = 0x8000000080000000;
      auVar112._12_4_ = 0x80000000;
      auVar112._16_4_ = 0x80000000;
      auVar112._20_4_ = 0x80000000;
      auVar112._24_4_ = 0x80000000;
      auVar112._28_4_ = 0x80000000;
      auVar104 = vandps_avx(auVar91,auVar112);
      uVar82 = auVar104._0_4_;
      auVar118._0_4_ =
           (float)(uVar82 ^ (uint)(fVar136 * auVar51._0_4_ +
                                  fVar158 * auVar52._0_4_ + fVar150 * auVar117._0_4_));
      uVar76 = auVar104._4_4_;
      auVar118._4_4_ =
           (float)(uVar76 ^ (uint)(fVar138 * auVar51._4_4_ +
                                  fVar160 * auVar52._4_4_ + fVar152 * auVar117._4_4_));
      uVar140 = auVar104._8_4_;
      auVar118._8_4_ =
           (float)(uVar140 ^
                  (uint)(fVar139 * auVar51._8_4_ +
                        fVar161 * auVar52._8_4_ + fVar153 * auVar117._8_4_));
      uVar142 = auVar104._12_4_;
      auVar118._12_4_ =
           (float)(uVar142 ^
                  (uint)(fVar141 * auVar51._12_4_ +
                        fVar163 * auVar52._12_4_ + fVar154 * auVar117._12_4_));
      uVar144 = auVar104._16_4_;
      auVar118._16_4_ =
           (float)(uVar144 ^
                  (uint)(fVar143 * auVar51._16_4_ +
                        fVar164 * auVar52._16_4_ + fVar155 * auVar117._16_4_));
      uVar146 = auVar104._20_4_;
      auVar118._20_4_ =
           (float)(uVar146 ^
                  (uint)(fVar145 * auVar51._20_4_ +
                        fVar165 * auVar52._20_4_ + fVar156 * auVar117._20_4_));
      uVar148 = auVar104._24_4_;
      auVar118._24_4_ =
           (float)(uVar148 ^
                  (uint)(fVar147 * auVar51._24_4_ +
                        fVar166 * auVar52._24_4_ + fVar157 * auVar117._24_4_));
      uVar149 = auVar104._28_4_;
      auVar118._28_4_ = (float)(uVar149 ^ (uint)(auVar92._28_4_ + auVar90._28_4_ + auVar111._28_4_))
      ;
      local_11c0._0_4_ =
           (float)(uVar82 ^ (uint)(auVar51._0_4_ * fVar101 +
                                  fVar100 * auVar52._0_4_ + fVar99 * auVar117._0_4_));
      local_11c0._4_4_ =
           (float)(uVar76 ^ (uint)(auVar51._4_4_ * fVar11 +
                                  fVar169 * auVar52._4_4_ + fVar168 * auVar117._4_4_));
      local_11c0._8_4_ =
           (float)(uVar140 ^
                  (uint)(auVar51._8_4_ * fVar18 + fVar17 * auVar52._8_4_ + fVar16 * auVar117._8_4_))
      ;
      local_11c0._12_4_ =
           (float)(uVar142 ^
                  (uint)(auVar51._12_4_ * fVar25 +
                        fVar24 * auVar52._12_4_ + fVar23 * auVar117._12_4_));
      local_11c0._16_4_ =
           (float)(uVar144 ^
                  (uint)(auVar51._16_4_ * fVar32 +
                        fVar31 * auVar52._16_4_ + fVar30 * auVar117._16_4_));
      local_11c0._20_4_ =
           (float)(uVar146 ^
                  (uint)(auVar51._20_4_ * fVar39 +
                        fVar38 * auVar52._20_4_ + fVar37 * auVar117._20_4_));
      local_11c0._24_4_ =
           (float)(uVar148 ^
                  (uint)(auVar51._24_4_ * fVar46 +
                        fVar45 * auVar52._24_4_ + fVar44 * auVar117._24_4_));
      local_11c0._28_4_ = (float)(uVar149 ^ (uint)(auVar52._28_4_ + auVar117._28_4_ + -0.0));
      auVar117 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar104 = vcmpps_avx(auVar118,auVar117,5);
      auVar117 = vcmpps_avx(local_11c0,auVar117,5);
      auVar104 = vandps_avx(auVar104,auVar117);
      auVar113._8_4_ = 0x7fffffff;
      auVar113._0_8_ = 0x7fffffff7fffffff;
      auVar113._12_4_ = 0x7fffffff;
      auVar113._16_4_ = 0x7fffffff;
      auVar113._20_4_ = 0x7fffffff;
      auVar113._24_4_ = 0x7fffffff;
      auVar113._28_4_ = 0x7fffffff;
      local_1180 = vandps_avx(auVar91,auVar113);
      auVar117 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar91,4);
      auVar104 = vandps_avx(auVar104,auVar117);
      auVar92._0_4_ = auVar118._0_4_ + local_11c0._0_4_;
      auVar92._4_4_ = auVar118._4_4_ + local_11c0._4_4_;
      auVar92._8_4_ = auVar118._8_4_ + local_11c0._8_4_;
      auVar92._12_4_ = auVar118._12_4_ + local_11c0._12_4_;
      auVar92._16_4_ = auVar118._16_4_ + local_11c0._16_4_;
      auVar92._20_4_ = auVar118._20_4_ + local_11c0._20_4_;
      auVar92._24_4_ = auVar118._24_4_ + local_11c0._24_4_;
      auVar92._28_4_ = auVar118._28_4_ + local_11c0._28_4_;
      auVar117 = vcmpps_avx(auVar92,local_1180,2);
      auVar92 = auVar117 & auVar104;
      if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar92 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar92 >> 0x7f,0) != '\0') ||
            (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar92 >> 0xbf,0) != '\0') ||
          (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar92[0x1f] < '\0') {
        auVar104 = vandps_avx(auVar104,auVar117);
        auVar88 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
        local_11a0._0_4_ =
             (float)(uVar82 ^ (uint)(fVar167 * fVar125 +
                                    (float)local_13c0._0_4_ * fVar102 + fVar126 * fVar162));
        local_11a0._4_4_ =
             (float)(uVar76 ^ (uint)(fVar15 * fVar13 +
                                    (float)local_13c0._4_4_ * fVar12 + fVar130 * fVar14));
        local_11a0._8_4_ =
             (float)(uVar140 ^ (uint)(fVar22 * fVar20 + fStack_13b8 * fVar19 + fVar131 * fVar21));
        local_11a0._12_4_ =
             (float)(uVar142 ^ (uint)(fVar29 * fVar27 + fStack_13b4 * fVar26 + fVar132 * fVar28));
        local_11a0._16_4_ =
             (float)(uVar144 ^ (uint)(fVar36 * fVar34 + fStack_13b0 * fVar33 + fVar133 * fVar35));
        local_11a0._20_4_ =
             (float)(uVar146 ^ (uint)(fVar43 * fVar41 + fStack_13ac * fVar40 + fVar134 * fVar42));
        local_11a0._24_4_ =
             (float)(uVar148 ^ (uint)(fVar50 * fVar48 + fStack_13a8 * fVar47 + fVar135 * fVar49));
        local_11a0._28_4_ = uVar149 ^ 0x7fc00000;
        fVar86 = *(float *)(ray + k * 4 + 0x30);
        fVar97 = local_1180._0_4_;
        fVar98 = local_1180._4_4_;
        auVar69._4_4_ = fVar98 * fVar86;
        auVar69._0_4_ = fVar97 * fVar86;
        fVar99 = local_1180._8_4_;
        auVar69._8_4_ = fVar99 * fVar86;
        fVar100 = local_1180._12_4_;
        auVar69._12_4_ = fVar100 * fVar86;
        fVar101 = local_1180._16_4_;
        auVar69._16_4_ = fVar101 * fVar86;
        fVar102 = local_1180._20_4_;
        auVar69._20_4_ = fVar102 * fVar86;
        fVar125 = local_1180._24_4_;
        auVar69._24_4_ = fVar125 * fVar86;
        auVar69._28_4_ = fVar86;
        auVar104 = vcmpps_avx(auVar69,local_11a0,1);
        fVar86 = *(float *)(ray + k * 4 + 0x80);
        auVar96 = ZEXT3264(CONCAT428(fVar86,CONCAT424(fVar86,CONCAT420(fVar86,CONCAT416(fVar86,
                                                  CONCAT412(fVar86,CONCAT48(fVar86,CONCAT44(fVar86,
                                                  fVar86))))))));
        auVar70._4_4_ = fVar86 * fVar98;
        auVar70._0_4_ = fVar86 * fVar97;
        auVar70._8_4_ = fVar86 * fVar99;
        auVar70._12_4_ = fVar86 * fVar100;
        auVar70._16_4_ = fVar86 * fVar101;
        auVar70._20_4_ = fVar86 * fVar102;
        auVar70._24_4_ = fVar86 * fVar125;
        auVar70._28_4_ = 0x7fffffff;
        auVar117 = vcmpps_avx(local_11a0,auVar70,2);
        auVar104 = vandps_avx(auVar104,auVar117);
        auVar103 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
        auVar88 = vpand_avx(auVar103,auVar88);
        auVar103 = vpmovzxwd_avx(auVar88);
        auVar127 = vpslld_avx(auVar103,0x1f);
        auVar87 = vpsrad_avx(auVar127,0x1f);
        auVar103 = vpunpckhwd_avx(auVar88,auVar88);
        auVar103 = vpslld_avx(auVar103,0x1f);
        auVar103 = vpsrad_avx(auVar103,0x1f);
        local_1380._16_16_ = auVar103;
        local_1380._0_16_ = auVar87;
        if ((((((((local_1380 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_1380 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_1380 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_1380 >> 0x7f,0) != '\0') ||
              (local_1380 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar103 >> 0x3f,0) != '\0') ||
            (local_1380 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar103[0xf] < '\0') {
          auStack_1338 = auVar105._8_24_;
          local_1340 = pSVar78;
          local_11e0 = auVar118;
          local_1160 = local_13a0;
          local_1140 = (float)local_13c0._0_4_;
          fStack_113c = (float)local_13c0._4_4_;
          fStack_1138 = fStack_13b8;
          fStack_1134 = fStack_13b4;
          fStack_1130 = fStack_13b0;
          fStack_112c = fStack_13ac;
          fStack_1128 = fStack_13a8;
          uStack_1124 = uStack_13a4;
          local_1100 = local_1380;
          local_1020 = local_fe0;
          auVar117 = vrcpps_avx(local_1180);
          fVar86 = auVar117._0_4_;
          auVar106._0_4_ = fVar97 * fVar86;
          fVar97 = auVar117._4_4_;
          auVar106._4_4_ = fVar98 * fVar97;
          fVar98 = auVar117._8_4_;
          auVar106._8_4_ = fVar99 * fVar98;
          fVar99 = auVar117._12_4_;
          auVar106._12_4_ = fVar100 * fVar99;
          fVar100 = auVar117._16_4_;
          auVar106._16_4_ = fVar101 * fVar100;
          fVar101 = auVar117._20_4_;
          auVar106._20_4_ = fVar102 * fVar101;
          fVar102 = auVar117._24_4_;
          auVar106._24_4_ = fVar125 * fVar102;
          auVar106._28_4_ = 0;
          auVar123._8_4_ = 0x3f800000;
          auVar123._0_8_ = 0x3f8000003f800000;
          auVar123._12_4_ = 0x3f800000;
          auVar123._16_4_ = 0x3f800000;
          auVar123._20_4_ = 0x3f800000;
          auVar123._24_4_ = 0x3f800000;
          auVar123._28_4_ = 0x3f800000;
          auVar105 = vsubps_avx(auVar123,auVar106);
          fVar86 = fVar86 + fVar86 * auVar105._0_4_;
          fVar97 = fVar97 + fVar97 * auVar105._4_4_;
          fVar98 = fVar98 + fVar98 * auVar105._8_4_;
          fVar99 = fVar99 + fVar99 * auVar105._12_4_;
          fVar100 = fVar100 + fVar100 * auVar105._16_4_;
          fVar101 = fVar101 + fVar101 * auVar105._20_4_;
          fVar102 = fVar102 + fVar102 * auVar105._24_4_;
          local_10a0._4_4_ = local_11a0._4_4_ * fVar97;
          local_10a0._0_4_ = local_11a0._0_4_ * fVar86;
          local_10a0._8_4_ = local_11a0._8_4_ * fVar98;
          local_10a0._12_4_ = local_11a0._12_4_ * fVar99;
          local_10a0._16_4_ = local_11a0._16_4_ * fVar100;
          local_10a0._20_4_ = local_11a0._20_4_ * fVar101;
          local_10a0._24_4_ = local_11a0._24_4_ * fVar102;
          local_10a0._28_4_ = local_11a0._28_4_;
          auVar124 = ZEXT3264(local_10a0);
          auVar71._4_4_ = fVar97 * auVar118._4_4_;
          auVar71._0_4_ = fVar86 * auVar118._0_4_;
          auVar71._8_4_ = fVar98 * auVar118._8_4_;
          auVar71._12_4_ = fVar99 * auVar118._12_4_;
          auVar71._16_4_ = fVar100 * auVar118._16_4_;
          auVar71._20_4_ = fVar101 * auVar118._20_4_;
          auVar71._24_4_ = fVar102 * auVar118._24_4_;
          auVar71._28_4_ = auVar105._28_4_;
          auVar104 = vminps_avx(auVar71,auVar123);
          auVar72._4_4_ = fVar97 * local_11c0._4_4_;
          auVar72._0_4_ = fVar86 * local_11c0._0_4_;
          auVar72._8_4_ = fVar98 * local_11c0._8_4_;
          auVar72._12_4_ = fVar99 * local_11c0._12_4_;
          auVar72._16_4_ = fVar100 * local_11c0._16_4_;
          auVar72._20_4_ = fVar101 * local_11c0._20_4_;
          auVar72._24_4_ = fVar102 * local_11c0._24_4_;
          auVar72._28_4_ = auVar117._28_4_ + auVar105._28_4_;
          auVar117 = vminps_avx(auVar72,auVar123);
          auVar105 = vsubps_avx(auVar123,auVar104);
          auVar92 = vsubps_avx(auVar123,auVar117);
          local_10c0 = vblendvps_avx(auVar117,auVar105,local_fe0);
          local_10e0 = vblendvps_avx(auVar104,auVar92,local_fe0);
          local_1080[0] = fVar167 * (float)local_1000._0_4_;
          local_1080[1] = fVar15 * (float)local_1000._4_4_;
          local_1080[2] = fVar22 * fStack_ff8;
          local_1080[3] = fVar29 * fStack_ff4;
          fStack_1070 = fVar36 * fStack_ff0;
          fStack_106c = fVar43 * fStack_fec;
          fStack_1068 = fVar50 * fStack_fe8;
          uStack_1064 = local_10e0._28_4_;
          local_1060[0] = (float)local_13c0._0_4_ * (float)local_1000._0_4_;
          local_1060[1] = (float)local_13c0._4_4_ * (float)local_1000._4_4_;
          local_1060[2] = fStack_13b8 * fStack_ff8;
          local_1060[3] = fStack_13b4 * fStack_ff4;
          fStack_1050 = fStack_13b0 * fStack_ff0;
          fStack_104c = fStack_13ac * fStack_fec;
          fStack_1048 = fStack_13a8 * fStack_fe8;
          uStack_1044 = auVar104._28_4_;
          local_1040[0] = fVar162 * (float)local_1000._0_4_;
          local_1040[1] = fVar14 * (float)local_1000._4_4_;
          local_1040[2] = fVar21 * fStack_ff8;
          local_1040[3] = fVar28 * fStack_ff4;
          fStack_1030 = fVar35 * fStack_ff0;
          fStack_102c = fVar42 * fStack_fec;
          fStack_1028 = fVar49 * fStack_fe8;
          uStack_1024 = uStack_fe4;
          auVar103 = vpunpckhwd_avx(auVar88,auVar88);
          auVar103 = vpslld_avx(auVar103,0x1f);
          auVar93._16_16_ = auVar103;
          auVar93._0_16_ = auVar127;
          auVar107._8_4_ = 0x7f800000;
          auVar107._0_8_ = 0x7f8000007f800000;
          auVar107._12_4_ = 0x7f800000;
          auVar107._16_4_ = 0x7f800000;
          auVar107._20_4_ = 0x7f800000;
          auVar107._24_4_ = 0x7f800000;
          auVar107._28_4_ = 0x7f800000;
          auVar104 = vblendvps_avx(auVar107,local_10a0,auVar93);
          auVar117 = vshufps_avx(auVar104,auVar104,0xb1);
          auVar117 = vminps_avx(auVar104,auVar117);
          auVar105 = vshufpd_avx(auVar117,auVar117,5);
          auVar117 = vminps_avx(auVar117,auVar105);
          auVar105 = vperm2f128_avx(auVar117,auVar117,1);
          auVar117 = vminps_avx(auVar117,auVar105);
          auVar104 = vcmpps_avx(auVar104,auVar117,0);
          auVar103 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
          auVar88 = vpand_avx(auVar103,auVar88);
          auVar103 = vpmovzxwd_avx(auVar88);
          auVar103 = vpslld_avx(auVar103,0x1f);
          auVar103 = vpsrad_avx(auVar103,0x1f);
          auVar88 = vpunpckhwd_avx(auVar88,auVar88);
          auVar88 = vpslld_avx(auVar88,0x1f);
          auVar88 = vpsrad_avx(auVar88,0x1f);
          auVar94._16_16_ = auVar88;
          auVar94._0_16_ = auVar103;
          if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar94 >> 0x7f,0) == '\0') &&
                (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar88 >> 0x3f,0) == '\0') &&
              (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar88[0xf]) {
            auVar94 = local_1380;
          }
          uVar76 = vmovmskps_avx(auVar94);
          uVar82 = 0;
          if (uVar76 != 0) {
            for (; (uVar76 >> uVar82 & 1) == 0; uVar82 = uVar82 + 1) {
            }
          }
LAB_00efa804:
          local_1418 = (ulong)uVar82;
          uVar82 = *(uint *)(local_fc0 + local_1418 * 4);
          local_1420 = (pSVar78->geometries).items[uVar82].ptr;
          if ((local_1420->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_1380 + local_1418 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (local_1420->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar1 = *(undefined4 *)(local_10e0 + local_1418 * 4);
              uVar2 = *(undefined4 *)(local_10c0 + local_1418 * 4);
              *(float *)(ray + k * 4 + 0x80) = local_1080[local_1418 - 8];
              *(float *)(ray + k * 4 + 0xc0) = local_1080[local_1418];
              *(float *)(ray + k * 4 + 0xd0) = local_1060[local_1418];
              *(float *)(ray + k * 4 + 0xe0) = local_1040[local_1418];
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar2;
              *(undefined4 *)(ray + k * 4 + 0x110) =
                   *(undefined4 *)((long)&local_12a0 + local_1418 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar82;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              goto LAB_00efa58f;
            }
            local_1360 = auVar124._0_32_;
            _local_13c0 = auVar96._0_32_;
            uVar1 = *(undefined4 *)(local_10e0 + local_1418 * 4);
            local_1240._4_4_ = uVar1;
            local_1240._0_4_ = uVar1;
            local_1240._8_4_ = uVar1;
            local_1240._12_4_ = uVar1;
            local_1230 = *(undefined4 *)(local_10c0 + local_1418 * 4);
            local_1210 = vpshufd_avx(ZEXT416(uVar82),0);
            uVar1 = *(undefined4 *)((long)&local_12a0 + local_1418 * 4);
            local_1220._4_4_ = uVar1;
            local_1220._0_4_ = uVar1;
            local_1220._8_4_ = uVar1;
            local_1220._12_4_ = uVar1;
            fVar86 = local_1080[local_1418];
            fVar97 = local_1060[local_1418];
            local_1260._4_4_ = fVar97;
            local_1260._0_4_ = fVar97;
            local_1260._8_4_ = fVar97;
            local_1260._12_4_ = fVar97;
            fVar97 = local_1040[local_1418];
            local_1250._4_4_ = fVar97;
            local_1250._0_4_ = fVar97;
            local_1250._8_4_ = fVar97;
            local_1250._12_4_ = fVar97;
            local_1270[0] = (RTCHitN)SUB41(fVar86,0);
            local_1270[1] = (RTCHitN)(char)((uint)fVar86 >> 8);
            local_1270[2] = (RTCHitN)(char)((uint)fVar86 >> 0x10);
            local_1270[3] = (RTCHitN)(char)((uint)fVar86 >> 0x18);
            local_1270[4] = (RTCHitN)SUB41(fVar86,0);
            local_1270[5] = (RTCHitN)(char)((uint)fVar86 >> 8);
            local_1270[6] = (RTCHitN)(char)((uint)fVar86 >> 0x10);
            local_1270[7] = (RTCHitN)(char)((uint)fVar86 >> 0x18);
            local_1270[8] = (RTCHitN)SUB41(fVar86,0);
            local_1270[9] = (RTCHitN)(char)((uint)fVar86 >> 8);
            local_1270[10] = (RTCHitN)(char)((uint)fVar86 >> 0x10);
            local_1270[0xb] = (RTCHitN)(char)((uint)fVar86 >> 0x18);
            local_1270[0xc] = (RTCHitN)SUB41(fVar86,0);
            local_1270[0xd] = (RTCHitN)(char)((uint)fVar86 >> 8);
            local_1270[0xe] = (RTCHitN)(char)((uint)fVar86 >> 0x10);
            local_1270[0xf] = (RTCHitN)(char)((uint)fVar86 >> 0x18);
            uStack_122c = local_1230;
            uStack_1228 = local_1230;
            uStack_1224 = local_1230;
            vcmpps_avx(ZEXT1632(local_1240),ZEXT1632(local_1240),0xf);
            uStack_11fc = context->user->instID[0];
            local_1200 = uStack_11fc;
            uStack_11f8 = uStack_11fc;
            uStack_11f4 = uStack_11fc;
            uStack_11f0 = context->user->instPrimID[0];
            uStack_11ec = uStack_11f0;
            uStack_11e8 = uStack_11f0;
            uStack_11e4 = uStack_11f0;
            local_13a0._0_8_ = k;
            *(float *)(ray + k * 4 + 0x80) = local_1080[local_1418 - 8];
            local_1430 = *local_1408;
            local_13f0.valid = (int *)local_1430;
            local_13f0.geometryUserPtr = local_1420->userPtr;
            local_13f0.context = context->user;
            local_13f0.hit = local_1270;
            local_13f0.N = 4;
            local_13f0.ray = (RTCRayN *)ray;
            if (local_1420->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*local_1420->intersectionFilterN)(&local_13f0);
            }
            if (local_1430 == (undefined1  [16])0x0) {
              auVar88 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar88 = auVar88 ^ _DAT_01f46b70;
            }
            else {
              p_Var10 = context->args->filter;
              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_1420->field_8).field_0x2 & 0x40) != 0))
                 )) {
                (*p_Var10)(&local_13f0);
              }
              auVar103 = vpcmpeqd_avx(local_1430,_DAT_01f45a50);
              auVar88 = auVar103 ^ _DAT_01f46b70;
              if (local_1430 != (undefined1  [16])0x0) {
                auVar103 = auVar103 ^ _DAT_01f46b70;
                auVar87 = vmaskmovps_avx(auVar103,*(undefined1 (*) [16])local_13f0.hit);
                *(undefined1 (*) [16])(local_13f0.ray + 0xc0) = auVar87;
                auVar87 = vmaskmovps_avx(auVar103,*(undefined1 (*) [16])(local_13f0.hit + 0x10));
                *(undefined1 (*) [16])(local_13f0.ray + 0xd0) = auVar87;
                auVar87 = vmaskmovps_avx(auVar103,*(undefined1 (*) [16])(local_13f0.hit + 0x20));
                *(undefined1 (*) [16])(local_13f0.ray + 0xe0) = auVar87;
                auVar87 = vmaskmovps_avx(auVar103,*(undefined1 (*) [16])(local_13f0.hit + 0x30));
                *(undefined1 (*) [16])(local_13f0.ray + 0xf0) = auVar87;
                auVar87 = vmaskmovps_avx(auVar103,*(undefined1 (*) [16])(local_13f0.hit + 0x40));
                *(undefined1 (*) [16])(local_13f0.ray + 0x100) = auVar87;
                auVar87 = vmaskmovps_avx(auVar103,*(undefined1 (*) [16])(local_13f0.hit + 0x50));
                *(undefined1 (*) [16])(local_13f0.ray + 0x110) = auVar87;
                auVar87 = vmaskmovps_avx(auVar103,*(undefined1 (*) [16])(local_13f0.hit + 0x60));
                *(undefined1 (*) [16])(local_13f0.ray + 0x120) = auVar87;
                auVar87 = vmaskmovps_avx(auVar103,*(undefined1 (*) [16])(local_13f0.hit + 0x70));
                *(undefined1 (*) [16])(local_13f0.ray + 0x130) = auVar87;
                auVar103 = vmaskmovps_avx(auVar103,*(undefined1 (*) [16])(local_13f0.hit + 0x80));
                *(undefined1 (*) [16])(local_13f0.ray + 0x140) = auVar103;
              }
            }
            auVar89._8_8_ = 0x100000001;
            auVar89._0_8_ = 0x100000001;
            if ((auVar89 & auVar88) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + local_13a0._0_8_ * 4 + 0x80) = local_13c0._0_4_;
            }
            else {
              _local_13c0 = ZEXT432(*(uint *)(ray + local_13a0._0_8_ * 4 + 0x80));
            }
            *(undefined4 *)(local_1380 + local_1418 * 4) = 0;
            auVar96 = ZEXT3264(_local_13c0);
            auVar88 = vshufps_avx(local_13c0._0_16_,local_13c0._0_16_,0);
            auVar95._16_16_ = auVar88;
            auVar95._0_16_ = auVar88;
            auVar124 = ZEXT3264(local_1360);
            auVar104 = vcmpps_avx(local_1360,auVar95,2);
            local_1380 = vandps_avx(auVar104,local_1380);
            pSVar78 = local_1340;
            k = local_13a0._0_8_;
          }
          if ((((((((local_1380 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_1380 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_1380 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_1380 >> 0x7f,0) == '\0') &&
                (local_1380 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_1380 >> 0xbf,0) == '\0') &&
              (local_1380 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_1380[0x1f]) goto LAB_00efa58f;
          auVar108._8_4_ = 0x7f800000;
          auVar108._0_8_ = 0x7f8000007f800000;
          auVar108._12_4_ = 0x7f800000;
          auVar108._16_4_ = 0x7f800000;
          auVar108._20_4_ = 0x7f800000;
          auVar108._24_4_ = 0x7f800000;
          auVar108._28_4_ = 0x7f800000;
          auVar104 = vblendvps_avx(auVar108,auVar124._0_32_,local_1380);
          auVar117 = vshufps_avx(auVar104,auVar104,0xb1);
          auVar117 = vminps_avx(auVar104,auVar117);
          auVar105 = vshufpd_avx(auVar117,auVar117,5);
          auVar117 = vminps_avx(auVar117,auVar105);
          auVar105 = vperm2f128_avx(auVar117,auVar117,1);
          auVar117 = vminps_avx(auVar117,auVar105);
          auVar117 = vcmpps_avx(auVar104,auVar117,0);
          auVar105 = local_1380 & auVar117;
          auVar104 = local_1380;
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar105 >> 0x7f,0) != '\0') ||
                (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0xbf,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar105[0x1f] < '\0') {
            auVar104 = vandps_avx(auVar117,local_1380);
          }
          uVar76 = vmovmskps_avx(auVar104);
          uVar82 = 0;
          if (uVar76 != 0) {
            for (; (uVar76 >> uVar82 & 1) == 0; uVar82 = uVar82 + 1) {
            }
          }
          goto LAB_00efa804;
        }
      }
LAB_00efa58f:
      auVar124 = ZEXT1664(local_12b0);
      auVar129 = ZEXT1664(local_12c0);
      auVar137 = ZEXT1664(local_12d0);
      auVar171 = ZEXT1664(local_1310);
      fVar86 = local_12e0;
      fVar99 = fStack_12dc;
      fVar100 = fStack_12d8;
      fVar101 = fStack_12d4;
      fVar97 = local_12f0;
      fVar102 = fStack_12ec;
      fVar125 = fStack_12e8;
      fVar162 = fStack_12e4;
      fVar98 = local_1300;
      fVar167 = fStack_12fc;
      fVar168 = fStack_12f8;
      fVar169 = fStack_12f4;
    }
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar96 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }